

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

void __thiscall
ParserTest_StringsWithInterpolation_Test::~ParserTest_StringsWithInterpolation_Test
          (ParserTest_StringsWithInterpolation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, StringsWithInterpolation) {
  P parser;
  EXPECT_TRUE(parser.parse("a = 'hi'"));
  EXPECT_FALSE(parser.parse("a = 'hi"));
  EXPECT_FALSE(parser.parse("a = 'hi\\"));
  EXPECT_FALSE(parser.parse("a = 'hi\\4 there'"));
  EXPECT_TRUE(parser.parse("a = 'h${there}i'"));
  EXPECT_FALSE(parser.parse("a = 'h$there}i'"));
  EXPECT_FALSE(parser.parse("a = 'h${t-here}i'"));
}